

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__profile_GLES__technique__pass__clip_plane
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *buffer;
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  undefined8 in_RAX;
  uint *puVar7;
  StringHash SVar8;
  uint64 uVar9;
  char cVar10;
  xmlChar **ppxVar11;
  bool failed;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  puVar7 = (uint *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                               ).super_ParserTemplateBase.mStackMemoryManager,0x28);
  uVar1 = profile_GLES__technique__pass__clip_plane__AttributeData::DEFAULT._8_8_;
  *(undefined8 *)puVar7 = profile_GLES__technique__pass__clip_plane__AttributeData::DEFAULT._0_8_;
  *(undefined8 *)(puVar7 + 2) = uVar1;
  uVar4 = profile_GLES__technique__pass__clip_plane__AttributeData::DEFAULT._28_4_;
  uVar3 = profile_GLES__technique__pass__clip_plane__AttributeData::DEFAULT._24_4_;
  uVar2 = profile_GLES__technique__pass__clip_plane__AttributeData::DEFAULT._20_4_;
  puVar7[4] = profile_GLES__technique__pass__clip_plane__AttributeData::DEFAULT._16_4_;
  puVar7[5] = uVar2;
  puVar7[6] = uVar3;
  puVar7[7] = uVar4;
  *(undefined8 *)(puVar7 + 8) =
       profile_GLES__technique__pass__clip_plane__AttributeData::DEFAULT._32_8_;
  *attributeDataPtr = puVar7;
  ppxVar11 = attributes->attributes;
  if (ppxVar11 != (xmlChar **)0x0) {
    do {
      text = *ppxVar11;
      if (text == (ParserChar *)0x0) {
        cVar10 = '\x03';
        goto LAB_006b5d11;
      }
      SVar8 = GeneratedSaxParser::Utils::calculateStringHash(text);
      buffer = ppxVar11[1];
      ppxVar11 = ppxVar11 + 2;
      if (SVar8 == 0x704ac8) {
        uVar9 = GeneratedSaxParser::Utils::toUint64(buffer,(bool *)((long)&uStack_38 + 7));
        *(uint64 *)(puVar7 + 8) = uVar9;
        if (uStack_38._7_1_ == '\x01') {
          bVar5 = false;
          bVar6 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x6618545,0x704ac8,buffer);
          if (!bVar6) goto LAB_006b5cf7;
          cVar10 = '\x01';
        }
        else {
LAB_006b5cf7:
          cVar10 = '\x04';
          bVar5 = true;
          if (uStack_38._7_1_ == '\0') {
            *(byte *)puVar7 = (byte)*puVar7 | 2;
          }
        }
        if (bVar5) goto LAB_006b5d0f;
      }
      else if (SVar8 == 0x76887d) {
        *(ParserChar **)(puVar7 + 6) = buffer;
LAB_006b5d0f:
        cVar10 = '\0';
      }
      else if (SVar8 == 0x7c83b5) {
        bVar5 = GeneratedSaxParser::
                ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                ::characterData2List<bool,_&GeneratedSaxParser::Utils::toBool>
                          (&this->
                            super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                           ,buffer,(XSList<bool> *)(puVar7 + 2));
        if (bVar5) {
          *(byte *)puVar7 = (byte)*puVar7 | 1;
          cVar10 = '\x04';
          bVar5 = true;
        }
        else {
          bVar5 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x6618545,0x7c83b5,buffer);
          bVar5 = !bVar5;
          cVar10 = bVar5 * '\x03' + '\x01';
        }
        if (bVar5) goto LAB_006b5d0f;
      }
      else {
        bVar5 = GeneratedSaxParser::ParserTemplateBase::handleError
                          ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                           ERROR_UNKNOWN_ATTRIBUTE,0x6618545,text,buffer);
        cVar10 = '\x01';
        if (!bVar5) goto LAB_006b5d0f;
      }
LAB_006b5d11:
    } while (cVar10 == '\0');
    if (cVar10 != '\x03') {
      return false;
    }
  }
  if ((*puVar7 & 1) == 0) {
    puVar7[2] = 0;
    puVar7[3] = 0;
    puVar7[4] = 0;
    puVar7[5] = 0;
  }
  if (((*puVar7 & 2) == 0) &&
     (bVar5 = GeneratedSaxParser::ParserTemplateBase::handleError
                        ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                         ERROR_REQUIRED_ATTRIBUTE_MISSING,0x6618545,0x704ac8,(ParserChar *)0x0),
     bVar5)) {
    return false;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__profile_GLES__technique__pass__clip_plane( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_GLES__technique__pass__clip_plane( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_GLES__technique__pass__clip_plane__AttributeData* attributeData = newData<profile_GLES__technique__pass__clip_plane__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_value:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2BoolList(attributeValue, attributeData->value, 0, HASH_ELEMENT_CLIP_PLANE, HASH_ATTRIBUTE_value);
    }
    else
    {
failed = !characterData2BoolList(attributeValue, attributeData->value);
    }
#else
    {
failed = !characterData2BoolList(attributeValue, attributeData->value);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_CLIP_PLANE,
        HASH_ATTRIBUTE_value,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__bool4(attributeData->value.data, attributeData->value.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_CLIP_PLANE,
            HASH_ATTRIBUTE_value,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= profile_GLES__technique__pass__clip_plane__AttributeData::ATTRIBUTE_VALUE_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_param:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_CLIP_PLANE,
            HASH_ATTRIBUTE_param,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_index:
    {
bool failed;
attributeData->index = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_CLIP_PLANE,
        HASH_ATTRIBUTE_index,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__GLES_MAX_CLIP_PLANES_index(attributeData->index);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_CLIP_PLANE,
            HASH_ATTRIBUTE_index,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif
if ( !failed )
    attributeData->present_attributes |= profile_GLES__technique__pass__clip_plane__AttributeData::ATTRIBUTE_INDEX_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_CLIP_PLANE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & profile_GLES__technique__pass__clip_plane__AttributeData::ATTRIBUTE_VALUE_PRESENT) == 0)
{
    attributeData->value = GeneratedSaxParser::XSList<bool>();
}
if ( (attributeData->present_attributes & profile_GLES__technique__pass__clip_plane__AttributeData::ATTRIBUTE_INDEX_PRESENT) == 0 )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_CLIP_PLANE, HASH_ATTRIBUTE_index, 0 ) )
        return false;
}


    return true;
}